

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::PackageSymbol::PackageSymbol
          (PackageSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          NetType *defaultNetType,VariableLifetime defaultLifetime)

{
  NetType *defaultNetType_local;
  Compilation *compilation_local;
  PackageSymbol *this_local;
  SourceLocation loc_local;
  string_view name_local;
  
  Symbol::Symbol(&this->super_Symbol,Package,name,loc);
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  this->defaultNetType = defaultNetType;
  TimeScale::TimeScale(&this->timeScale);
  this->defaultLifetime = defaultLifetime;
  nonstd::span_lite::
  span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>::span<true,_0>
            (&this->exportDecls);
  this->hasExportAll = false;
  this->hasForceElaborated = false;
  return;
}

Assistant:

PackageSymbol::PackageSymbol(Compilation& compilation, string_view name, SourceLocation loc,
                             const NetType& defaultNetType, VariableLifetime defaultLifetime) :
    Symbol(SymbolKind::Package, name, loc),
    Scope(compilation, this), defaultNetType(defaultNetType), defaultLifetime(defaultLifetime) {
}